

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

int __thiscall
CVmObjGramProd::getp_clearAlts(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  uint dict;
  uint uVar6;
  
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  if (getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_clearAlts();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_clearAlts::desc);
  if (iVar3 == 0) {
    dict = 0;
    if (0 < (int)uVar6) {
      if (sp_[-1].typ != VM_NIL) {
        if (sp_[-1].typ != VM_OBJ) {
LAB_0025f2e8:
          err_throw(0x900);
        }
        dict = sp_[-1].val.obj;
        iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[dict >> 0xc][dict & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[dict >> 0xc] + (dict & 0xfff),
                           CVmObjDict::metaclass_reg_);
        if (iVar3 == 0) goto LAB_0025f2e8;
      }
    }
    pcVar4 = (this->super_CVmObject).ext_;
    if (*(long *)(pcVar4 + 0x38) != 0) {
      uVar5 = 0;
      do {
        *(undefined4 *)(*(long *)(*(long *)(pcVar4 + 0x30) + uVar5 * 8) + 8) = 1;
        uVar5 = uVar5 + 1;
        pcVar4 = (this->super_CVmObject).ext_;
      } while (uVar5 < *(ulong *)(pcVar4 + 0x38));
    }
    pvVar2 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    delete_marked_alts(this,self,dict);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    sp_ = sp_ + (int)~uVar6;
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_clearAlts(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    const vm_val_t *v;

    /* check arguments */
    int argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the dictionary object, if specified */
    vm_obj_id_t dict = VM_INVALID_OBJ;
    if (argc >= 1
        && (v = G_stk->get(0))->typ != VM_NIL
        && (v->typ != VM_OBJ
            || !CVmObjDict::is_dictionary_obj(vmg_ dict = v->val.obj)))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* mark every alternative for deletion */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
        get_ext()->alts_[i]->del = TRUE;

    /* save 'self' for gc protection */
    G_interpreter->push_obj(vmg_ self);

    /* delete the batch */
    delete_marked_alts(vmg_ self, dict);

    /* return self */
    retval->set_obj(self);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}